

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QAbstractItemModelPrivate::Change>::
emplace<QAbstractItemModelPrivate::Change_const&>
          (QMovableArrayOps<QAbstractItemModelPrivate::Change> *this,qsizetype i,Change *args)

{
  Change **ppCVar1;
  qsizetype *pqVar2;
  Change *pCVar3;
  totally_ordered_wrapper<const_QAbstractItemModel_*> *ptVar4;
  long lVar5;
  Data *pDVar6;
  Change *pCVar7;
  undefined8 uVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  QAbstractItemModel *pQVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined7 uVar20;
  quintptr qVar21;
  long in_FS_OFFSET;
  bool bVar22;
  int local_58;
  int iStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar6 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
           super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.d;
  if ((pDVar6 == (Data *)0x0) ||
     (1 < (__int_type_conflict)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_0045822d:
    uVar8 = *(undefined8 *)&args->needsAdjust;
    uVar15 = (args->parent).r;
    uVar16 = (args->parent).c;
    qVar21 = (args->parent).i;
    pQVar17 = (args->parent).m.ptr;
    uVar18 = args->first;
    uVar19 = args->last;
    bVar22 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size != 0;
    QArrayDataPointer<QAbstractItemModelPrivate::Change>::detachAndGrow
              ((QArrayDataPointer<QAbstractItemModelPrivate::Change> *)this,(uint)(i == 0 && bVar22)
               ,1,(Change **)0x0,(QArrayDataPointer<QAbstractItemModelPrivate::Change> *)0x0);
    pCVar7 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
    uStack_50 = (undefined4)qVar21;
    uStack_4c = (undefined4)(qVar21 >> 0x20);
    local_48 = SUB84(pQVar17,0);
    uStack_44 = (undefined4)((ulong)pQVar17 >> 0x20);
    if (i != 0 || !bVar22) {
      pCVar3 = pCVar7 + i;
      memmove(pCVar3 + 1,pCVar7 + i,
              ((this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
               super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size - i) * 0x28);
      (pCVar3->parent).r = uVar15;
      (pCVar3->parent).c = uVar16;
      *(undefined4 *)&(pCVar3->parent).i = uStack_50;
      *(undefined4 *)((long)&(pCVar3->parent).i + 4) = uStack_4c;
      *(undefined4 *)&(pCVar3->parent).m.ptr = local_48;
      *(undefined4 *)((long)&(pCVar3->parent).m.ptr + 4) = uStack_44;
      pCVar3->first = uVar18;
      pCVar3->last = uVar19;
      *(undefined8 *)&pCVar3->needsAdjust = uVar8;
      goto LAB_004582db;
    }
    *(undefined8 *)&pCVar7[-1].needsAdjust = uVar8;
    *(undefined4 *)&pCVar7[-1].parent.m.ptr = local_48;
    *(undefined4 *)((long)&pCVar7[-1].parent.m.ptr + 4) = uStack_44;
    pCVar7[-1].first = uVar18;
    pCVar7[-1].last = uVar19;
    pCVar7[-1].parent.r = uVar15;
    pCVar7[-1].parent.c = uVar16;
    *(undefined4 *)&pCVar7[-1].parent.i = uStack_50;
    *(undefined4 *)((long)&pCVar7[-1].parent.i + 4) = uStack_4c;
  }
  else {
    if (((this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
         super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size == i) &&
       (pCVar7 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
                 super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr,
       (pDVar6->super_QArrayData).alloc - i !=
       ((long)((long)pCVar7 -
              ((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       -0x3333333333333333)) {
      uVar20 = *(undefined7 *)&args->field_0x21;
      pCVar7[i].needsAdjust = args->needsAdjust;
      *(undefined7 *)&pCVar7[i].field_0x21 = uVar20;
      iVar9 = (args->parent).r;
      iVar10 = (args->parent).c;
      qVar21 = (args->parent).i;
      uVar11 = *(undefined4 *)((long)&(args->parent).i + 4);
      uVar12 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
      iVar13 = args->first;
      iVar14 = args->last;
      ptVar4 = &pCVar7[i].parent.m;
      *(undefined4 *)&ptVar4->ptr = *(undefined4 *)&(args->parent).m.ptr;
      *(undefined4 *)((long)&ptVar4->ptr + 4) = uVar12;
      *(int *)(ptVar4 + 1) = iVar13;
      *(int *)((long)(ptVar4 + 1) + 4) = iVar14;
      pCVar7 = pCVar7 + i;
      (pCVar7->parent).r = iVar9;
      (pCVar7->parent).c = iVar10;
      *(int *)&(pCVar7->parent).i = (int)qVar21;
      *(undefined4 *)((long)&(pCVar7->parent).i + 4) = uVar11;
      goto LAB_004582db;
    }
    if ((i != 0) ||
       (pCVar7 = (this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
                 super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr,
       (Change *)((ulong)((long)&pDVar6[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pCVar7)) goto LAB_0045822d;
    uVar20 = *(undefined7 *)&args->field_0x21;
    pCVar7[-1].needsAdjust = args->needsAdjust;
    *(undefined7 *)&pCVar7[-1].field_0x21 = uVar20;
    iVar9 = (args->parent).r;
    iVar10 = (args->parent).c;
    qVar21 = (args->parent).i;
    uVar11 = *(undefined4 *)((long)&(args->parent).i + 4);
    uVar12 = *(undefined4 *)((long)&(args->parent).m.ptr + 4);
    iVar13 = args->first;
    iVar14 = args->last;
    *(undefined4 *)&pCVar7[-1].parent.m.ptr = *(undefined4 *)&(args->parent).m.ptr;
    *(undefined4 *)((long)&pCVar7[-1].parent.m.ptr + 4) = uVar12;
    pCVar7[-1].first = iVar13;
    pCVar7[-1].last = iVar14;
    pCVar7[-1].parent.r = iVar9;
    pCVar7[-1].parent.c = iVar10;
    *(int *)&pCVar7[-1].parent.i = (int)qVar21;
    *(undefined4 *)((long)&pCVar7[-1].parent.i + 4) = uVar11;
  }
  ppCVar1 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
             super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.ptr;
  *ppCVar1 = *ppCVar1 + -1;
LAB_004582db:
  pqVar2 = &(this->super_QGenericArrayOps<QAbstractItemModelPrivate::Change>).
            super_QArrayDataPointer<QAbstractItemModelPrivate::Change>.size;
  *pqVar2 = *pqVar2 + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }